

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_parity_uint64_192_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [16];
  word *pwVar2;
  ulong uVar3;
  block_t *vblock;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  for (uVar4 = 0x22; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    auVar1 = vpand_avx(*(undefined1 (*) [16])(v->w64 + 1),*(undefined1 (*) [16])(At->w64 + 1));
    pwVar2 = At->w64;
    At = At + 1;
    uVar5 = vpextrq_avx(auVar1,1);
    uVar3 = uVar3 | (ulong)((uint)POPCOUNT(uVar5 ^ auVar1._0_8_ ^ *pwVar2 & v->w64[0]) & 1) <<
                    (uVar4 & 0x3f);
  }
  c->w64[0] = 0;
  c->w64[1] = 0;
  c->w64[2] = uVar3;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_192_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 30; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 30 - i);
    const word parity =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]) ^
                        (vblock->w64[2] & Ablock->w64[2]));
    res |= parity << (64 - i);
  }
  for (unsigned int j = 0; j < 2; j++) {
    cblock->w64[j] = 0;
  }
  cblock->w64[2] = res;
}